

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebFront.hpp
# Opt level: O0

void __thiscall
webfront::
BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
::BasicWF(BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
          *this,string_view port,path *docRoot)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  function<void_(std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>_&&,_webfront::http::Protocol)>
  *handler;
  Server<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
  *this_00;
  anon_class_8_1_8991fb9c *__f;
  path *in_stack_00000038;
  Server<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
  *in_stack_00000040;
  undefined1 in_stack_00000048 [16];
  string_view in_stack_00000058;
  path *in_stack_ffffffffffffff20;
  path *in_stack_ffffffffffffff28;
  path *in_stack_ffffffffffffff30;
  function<void_(std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>_&&,_webfront::http::Protocol)>
  local_a0 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_10;
  undefined8 uStack_8;
  
  local_10 = in_RSI;
  uStack_8 = in_RDX;
  http::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff30,
             (char *)in_stack_ffffffffffffff28);
  local_48 = local_10;
  uStack_40 = uStack_8;
  http::std::filesystem::__cxx11::path::path(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  http::
  Server<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
  ::Server(in_stack_00000040,in_stack_00000058,(string_view)in_stack_00000048,in_stack_00000038);
  http::std::filesystem::__cxx11::path::~path(in_stack_ffffffffffffff20);
  handler = (function<void_(std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>_&&,_webfront::http::Protocol)>
             *)(in_RDI + 0xa8);
  http::std::
  map<unsigned_short,_webfront::WebLink<webfront::networking::TCPNetworkingTS>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_webfront::WebLink<webfront::networking::TCPNetworkingTS>_>_>_>
  ::map((map<unsigned_short,_webfront::WebLink<webfront::networking::TCPNetworkingTS>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_webfront::WebLink<webfront::networking::TCPNetworkingTS>_>_>_>
         *)0x10cf86);
  *(undefined2 *)(in_RDI + 0xd8) = 0;
  this_00 = (Server<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
             *)(in_RDI + 0xe0);
  http::std::
  function<void_(webfront::BasicUI<webfront::BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>_>)>
  ::function((function<void_(webfront::BasicUI<webfront::BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>_>)>
              *)this_00);
  __f = (anon_class_8_1_8991fb9c *)(in_RDI + 0x100);
  http::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::span<const_std::byte,_18446744073709551615UL>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::span<const_std::byte,_18446744073709551615UL>)>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::span<const_std::byte,_18446744073709551615UL>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::span<const_std::byte,_18446744073709551615UL>)>_>_>_>
         *)0x10cfbb);
  std::
  function<void(std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>&&,webfront::http::Protocol)>
  ::
  function<webfront::BasicWF<webfront::networking::TCPNetworkingTS,webfront::fs::Multi<webfront::fs::NativeDebugFS,webfront::fs::IndexFS,webfront::fs::ReactFS,webfront::fs::BabelFS>>::BasicWF(std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path)::_lambda(std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>&&,webfront::http::Protocol)_1_,void>
            (local_a0,__f);
  http::
  Server<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
  ::onUpgrade(this_00,handler);
  http::std::
  function<void_(std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>_&&,_webfront::http::Protocol)>
  ::~function((function<void_(std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>_&&,_webfront::http::Protocol)>
               *)0x10cff4);
  return;
}

Assistant:

BasicWF(std::string_view port, std::filesystem::path docRoot = ".") : httpServer("0.0.0.0", port, docRoot), idsCounter(0) {
        httpServer.onUpgrade([this](typename Net::Socket&& socket, http::Protocol protocol) {
            if (protocol == http::Protocol::WebSocket)
                for (bool inserted = false; !inserted; ++idsCounter)
                    std::tie(std::ignore, inserted) = webLinks.try_emplace(idsCounter, std::move(socket), idsCounter,
                                                                           [this](WebLinkEvent event) { onEvent(event); });
        });
    }